

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

CVmGramProdState *
CVmGramProdState::alloc
          (CVmGramProdMem *mem,int tok_pos,int alt_pos,CVmGramProdState *enclosing,
          vmgram_alt_info *altp,vm_obj_id_t prod_obj,int circular_alt)

{
  CVmGramProdState *this;
  uint in_ESI;
  CVmGramProdState *state;
  size_t match_cnt;
  size_t in_stack_ffffffffffffffc0;
  CVmGramProdMem *in_stack_ffffffffffffffc8;
  
  this = (CVmGramProdState *)
         CVmGramProdMem::alloc(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  init(this,(EVP_PKEY_CTX *)(ulong)in_ESI);
  return this;
}

Assistant:

static CVmGramProdState *alloc(CVmGramProdMem *mem,
                                   int tok_pos, int alt_pos,
                                   CVmGramProdState *enclosing,
                                   const vmgram_alt_info *altp,
                                   vm_obj_id_t prod_obj,
                                   int circular_alt)
    {
        size_t match_cnt;
        CVmGramProdState *state;

        /* get the number of match list slots we'll need */
        match_cnt = altp->tok_cnt;

        /* allocate space, including space for the match list */
        state = (CVmGramProdState *)
                mem->alloc(sizeof(CVmGramProdState)
                           + (match_cnt - 1)*sizeof(CVmGramProdMatch *));

        /* initialize */
        state->init(tok_pos, alt_pos, enclosing, altp, prod_obj,
                    circular_alt);

        /* return the new item */
        return state;
    }